

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

bool __thiscall capnp::DynamicStruct::Reader::has(Reader *this,Field field,HasMode mode)

{
  bool bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  uint16_t uVar4;
  Which WVar5;
  Which WVar6;
  uint32_t uVar7;
  StructDataOffset SVar8;
  uint uVar9;
  StructPointerOffset ptrIndex;
  unsigned_long uVar10;
  bool local_1d9;
  bool local_1c9;
  bool local_1b9;
  bool local_1a9;
  bool local_199;
  PointerReader local_168;
  undefined1 local_148 [8];
  Type type;
  Reader slot;
  Reader local_d8;
  unsigned_short local_a2;
  undefined1 local_a0 [6];
  uint16_t discrim;
  Reader proto;
  Fault local_60;
  Fault f;
  StructSchema local_50;
  undefined1 local_48 [8];
  DebugComparison<capnp::StructSchema,_const_capnp::StructSchema_&> _kjCondition;
  HasMode mode_local;
  Reader *this_local;
  
  _kjCondition._39_1_ = mode;
  f.exception = (Exception *)StructSchema::Field::getContainingStruct(&field);
  local_50.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StructSchema *)&f);
  kj::_::DebugExpression<capnp::StructSchema>::operator==
            ((DebugComparison<capnp::StructSchema,_const_capnp::StructSchema_&> *)local_48,
             (DebugExpression<capnp::StructSchema> *)&local_50,&this->schema);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema_const&>&,char_const(&)[39]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x1a2,FAILED,"field.getContainingStruct() == schema",
               "_kjCondition,\"`field` is not a field of this struct.\"",
               (DebugComparison<capnp::StructSchema,_const_capnp::StructSchema_&> *)local_48,
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  StructSchema::Field::getProto((Reader *)local_a0,&field);
  bVar1 = anon_unknown_70::hasDiscriminantValue((Reader *)local_a0);
  if (bVar1) {
    Schema::getProto((Reader *)&slot._reader.nestingLimit,(Schema *)this);
    capnp::schema::Node::Reader::getStruct(&local_d8,(Reader *)&slot._reader.nestingLimit);
    uVar7 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(&local_d8);
    SVar8 = assumeDataOffset(uVar7);
    uVar3 = capnp::_::StructReader::getDataField<unsigned_short>(&this->reader,SVar8);
    local_a2 = uVar3;
    uVar4 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)local_a0);
    if (uVar3 != uVar4) {
      return false;
    }
  }
  WVar5 = capnp::schema::Field::Reader::which((Reader *)local_a0);
  if ((WVar5 == SLOT) || (WVar5 != GROUP)) {
    capnp::schema::Field::Reader::getSlot((Reader *)&type.field_4,(Reader *)local_a0);
    _local_148 = StructSchema::Field::getType(&field);
    WVar6 = capnp::Type::which((Type *)local_148);
    switch(WVar6) {
    case VOID:
      this_local._7_1_ = _kjCondition._39_1_ == '\0';
      break;
    case BOOL:
      local_199 = true;
      if (_kjCondition._39_1_ != '\0') {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        local_199 = capnp::_::StructReader::getDataField<bool>(&this->reader,SVar8,false);
      }
      this_local._7_1_ = local_199;
      break;
    case INT8:
    case UINT8:
      local_1a9 = true;
      if (_kjCondition._39_1_ != '\0') {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar2 = capnp::_::StructReader::getDataField<unsigned_char>(&this->reader,SVar8,'\0');
        local_1a9 = uVar2 != '\0';
      }
      this_local._7_1_ = local_1a9;
      break;
    case INT16:
    case UINT16:
    case ENUM:
      local_1b9 = true;
      if (_kjCondition._39_1_ != '\0') {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar3 = capnp::_::StructReader::getDataField<unsigned_short>(&this->reader,SVar8,0);
        local_1b9 = uVar3 != 0;
      }
      this_local._7_1_ = local_1b9;
      break;
    case INT32:
    case UINT32:
    case FLOAT32:
      local_1c9 = true;
      if (_kjCondition._39_1_ != '\0') {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar9 = capnp::_::StructReader::getDataField<unsigned_int>(&this->reader,SVar8,0);
        local_1c9 = uVar9 != 0;
      }
      this_local._7_1_ = local_1c9;
      break;
    case INT64:
    case UINT64:
    case FLOAT64:
      local_1d9 = true;
      if (_kjCondition._39_1_ != '\0') {
        uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
        SVar8 = assumeDataOffset(uVar7);
        uVar10 = capnp::_::StructReader::getDataField<unsigned_long>(&this->reader,SVar8,0);
        local_1d9 = uVar10 != 0;
      }
      this_local._7_1_ = local_1d9;
      break;
    case TEXT:
    case DATA:
    case LIST:
    case STRUCT:
    case INTERFACE:
    case ANY_POINTER:
      uVar7 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&type.field_4);
      ptrIndex = assumePointerOffset(uVar7);
      capnp::_::StructReader::getPointerField(&local_168,&this->reader,ptrIndex);
      bVar1 = capnp::_::PointerReader::isNull(&local_168);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      break;
    default:
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicStruct::Reader::has(StructSchema::Field field, HasMode mode) const {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");

  auto proto = field.getProto();
  if (hasDiscriminantValue(proto)) {
    uint16_t discrim = reader.getDataField<uint16_t>(
        assumeDataOffset(schema.getProto().getStruct().getDiscriminantOffset()));
    if (discrim != proto.getDiscriminantValue()) {
      // Field is not active in the union.
      return false;
    }
  }

  switch (proto.which()) {
    case schema::Field::SLOT:
      // Continue to below.
      break;

    case schema::Field::GROUP:
      return true;
  }

  auto slot = proto.getSlot();
  auto type = field.getType();

  switch (type.which()) {
    case schema::Type::VOID:
      // Void is always equal to the default.
      return mode == HasMode::NON_NULL;

    case schema::Type::BOOL:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<bool>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT8:
    case schema::Type::UINT8:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint8_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT16:
    case schema::Type::UINT16:
    case schema::Type::ENUM:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint16_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT32:
    case schema::Type::UINT32:
    case schema::Type::FLOAT32:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint32_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::INT64:
    case schema::Type::UINT64:
    case schema::Type::FLOAT64:
      return mode == HasMode::NON_NULL ||
          reader.getDataField<uint64_t>(assumeDataOffset(slot.getOffset()), 0) != 0;

    case schema::Type::TEXT:
    case schema::Type::DATA:
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::ANY_POINTER:
    case schema::Type::INTERFACE:
      return !reader.getPointerField(assumePointerOffset(slot.getOffset())).isNull();
  }

  // Unknown type.  As far as we know, it isn't set.
  return false;
}